

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetInputSource.cc
# Opt level: O0

void __thiscall
OffsetInputSource::OffsetInputSource
          (OffsetInputSource *this,shared_ptr<InputSource> *proxied,qpdf_offset_t global_offset)

{
  logic_error *this_00;
  longlong lVar1;
  qpdf_offset_t global_offset_local;
  shared_ptr<InputSource> *proxied_local;
  OffsetInputSource *this_local;
  
  InputSource::InputSource(&this->super_InputSource);
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__OffsetInputSource_0058bf20;
  std::shared_ptr<InputSource>::shared_ptr(&this->proxied,proxied);
  this->global_offset = global_offset;
  if (global_offset < 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"OffsetInputSource constructed with negative offset");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  lVar1 = std::numeric_limits<long_long>::max();
  this->max_safe_offset = lVar1 - global_offset;
  return;
}

Assistant:

OffsetInputSource::OffsetInputSource(
    std::shared_ptr<InputSource> proxied, qpdf_offset_t global_offset) :
    proxied(proxied),
    global_offset(global_offset)
{
    if (global_offset < 0) {
        throw std::logic_error("OffsetInputSource constructed with negative offset");
    }
    this->max_safe_offset = std::numeric_limits<qpdf_offset_t>::max() - global_offset;
}